

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  int iVar3;
  undefined1 auVar4 [16];
  Scene *pSVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  ulong uVar64;
  long lVar65;
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  long lVar71;
  ulong *puVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  bool bVar76;
  float fVar82;
  float fVar83;
  undefined1 auVar77 [16];
  float fVar85;
  float fVar86;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar84;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar97;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar108;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar106;
  float fVar107;
  undefined1 auVar105 [64];
  float fVar109;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar113 [64];
  float fVar120;
  float fVar121;
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar127;
  undefined1 auVar124 [32];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar136 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  undefined1 auVar153 [32];
  float fVar155;
  undefined1 auVar154 [64];
  float fVar156;
  float fVar157;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar160 [64];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  float fVar169;
  undefined1 auVar170 [32];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar171 [64];
  float fVar178;
  float fVar179;
  undefined1 auVar180 [32];
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar181 [64];
  float fVar195;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar196 [64];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  float fVar205;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar206 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  long local_1908;
  undefined1 local_1880 [16];
  undefined1 local_1870 [16];
  undefined1 local_1860 [32];
  undefined1 local_1840 [32];
  undefined1 local_1820 [32];
  undefined1 local_1800 [32];
  undefined1 local_17e0 [32];
  RTCFilterFunctionNArguments local_17b0;
  undefined1 local_1780 [32];
  undefined1 local_1760 [32];
  undefined1 local_1740 [32];
  undefined1 local_1720 [32];
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [8];
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  undefined4 uStack_1524;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  float local_1360 [4];
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  undefined4 uStack_1344;
  undefined1 local_1340 [32];
  RTCHitN local_1320 [32];
  undefined4 local_1300;
  undefined4 uStack_12fc;
  undefined4 uStack_12f8;
  undefined4 uStack_12f4;
  undefined4 uStack_12f0;
  undefined4 uStack_12ec;
  undefined4 uStack_12e8;
  undefined4 uStack_12e4;
  undefined1 local_12e0 [32];
  undefined4 local_12c0;
  undefined4 uStack_12bc;
  undefined4 uStack_12b8;
  undefined4 uStack_12b4;
  undefined4 uStack_12b0;
  undefined4 uStack_12ac;
  undefined4 uStack_12a8;
  undefined4 uStack_12a4;
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 uStack_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined4 local_1280;
  undefined4 uStack_127c;
  undefined4 uStack_1278;
  undefined4 uStack_1274;
  undefined4 uStack_1270;
  undefined4 uStack_126c;
  undefined4 uStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  undefined1 auVar125 [64];
  
  puVar72 = local_11f8;
  local_1200 = root.ptr;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar152 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(
                                                  uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar154 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(
                                                  uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar160 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(
                                                  uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
  fVar120 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar126 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar128 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar77 = ZEXT416((uint)(fVar120 * 0.99999964));
  auVar77 = vshufps_avx(auVar77,auVar77,0);
  auVar168 = ZEXT3264(CONCAT1616(auVar77,auVar77));
  auVar77 = ZEXT416((uint)(fVar126 * 0.99999964));
  auVar77 = vshufps_avx(auVar77,auVar77,0);
  auVar171 = ZEXT3264(CONCAT1616(auVar77,auVar77));
  auVar77 = ZEXT416((uint)(fVar128 * 0.99999964));
  auVar77 = vshufps_avx(auVar77,auVar77,0);
  auVar181 = ZEXT3264(CONCAT1616(auVar77,auVar77));
  auVar77 = ZEXT416((uint)(fVar120 * 1.0000004));
  auVar77 = vshufps_avx(auVar77,auVar77,0);
  auVar196 = ZEXT3264(CONCAT1616(auVar77,auVar77));
  auVar77 = ZEXT416((uint)(fVar126 * 1.0000004));
  auVar77 = vshufps_avx(auVar77,auVar77,0);
  auVar204 = ZEXT3264(CONCAT1616(auVar77,auVar77));
  auVar77 = ZEXT416((uint)(fVar128 * 1.0000004));
  auVar77 = vshufps_avx(auVar77,auVar77,0);
  auVar206 = ZEXT3264(CONCAT1616(auVar77,auVar77));
  uVar73 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar69 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar75 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar68 = uVar73 ^ 0x20;
  iVar3 = (tray->tnear).field_0.i[k];
  auVar105 = ZEXT3264(CONCAT428(iVar3,CONCAT424(iVar3,CONCAT420(iVar3,CONCAT416(iVar3,CONCAT412(
                                                  iVar3,CONCAT48(iVar3,CONCAT44(iVar3,iVar3))))))));
  iVar3 = (tray->tfar).field_0.i[k];
  auVar113 = ZEXT3264(CONCAT428(iVar3,CONCAT424(iVar3,CONCAT420(iVar3,CONCAT416(iVar3,CONCAT412(
                                                  iVar3,CONCAT48(iVar3,CONCAT44(iVar3,iVar3))))))));
  auVar122._16_16_ = mm_lookupmask_ps._240_16_;
  auVar122._0_16_ = mm_lookupmask_ps._0_16_;
  auVar125 = ZEXT3264(auVar122);
  uVar66 = 1 << ((byte)k & 0x1f);
  auVar87._8_4_ = 0x3f800000;
  auVar87._0_8_ = 0x3f8000003f800000;
  auVar87._12_4_ = 0x3f800000;
  auVar87._16_4_ = 0x3f800000;
  auVar87._20_4_ = 0x3f800000;
  auVar87._24_4_ = 0x3f800000;
  auVar87._28_4_ = 0x3f800000;
  auVar78._8_4_ = 0xbf800000;
  auVar78._0_8_ = 0xbf800000bf800000;
  auVar78._12_4_ = 0xbf800000;
  auVar78._16_4_ = 0xbf800000;
  auVar78._20_4_ = 0xbf800000;
  auVar78._24_4_ = 0xbf800000;
  auVar78._28_4_ = 0xbf800000;
  _local_1540 = vblendvps_avx(auVar87,auVar78,auVar122);
  bVar76 = true;
  do {
    uVar74 = puVar72[-1];
    puVar72 = puVar72 + -1;
    local_1620 = auVar105._0_32_;
    local_1640 = auVar113._0_32_;
    local_1680 = auVar152._0_32_;
    local_16a0 = auVar154._0_32_;
    local_16c0 = auVar160._0_32_;
    while ((uVar74 & 8) == 0) {
      auVar78 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + uVar73),local_1680);
      auVar23._4_4_ = auVar168._4_4_ * auVar78._4_4_;
      auVar23._0_4_ = auVar168._0_4_ * auVar78._0_4_;
      auVar23._8_4_ = auVar168._8_4_ * auVar78._8_4_;
      auVar23._12_4_ = auVar168._12_4_ * auVar78._12_4_;
      auVar23._16_4_ = auVar168._16_4_ * auVar78._16_4_;
      auVar23._20_4_ = auVar168._20_4_ * auVar78._20_4_;
      auVar23._24_4_ = auVar168._24_4_ * auVar78._24_4_;
      auVar23._28_4_ = auVar78._28_4_;
      auVar78 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + uVar69),local_16a0);
      auVar24._4_4_ = auVar171._4_4_ * auVar78._4_4_;
      auVar24._0_4_ = auVar171._0_4_ * auVar78._0_4_;
      auVar24._8_4_ = auVar171._8_4_ * auVar78._8_4_;
      auVar24._12_4_ = auVar171._12_4_ * auVar78._12_4_;
      auVar24._16_4_ = auVar171._16_4_ * auVar78._16_4_;
      auVar24._20_4_ = auVar171._20_4_ * auVar78._20_4_;
      auVar24._24_4_ = auVar171._24_4_ * auVar78._24_4_;
      auVar24._28_4_ = auVar78._28_4_;
      auVar78 = vmaxps_avx(auVar23,auVar24);
      auVar87 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + uVar75),local_16c0);
      auVar25._4_4_ = auVar181._4_4_ * auVar87._4_4_;
      auVar25._0_4_ = auVar181._0_4_ * auVar87._0_4_;
      auVar25._8_4_ = auVar181._8_4_ * auVar87._8_4_;
      auVar25._12_4_ = auVar181._12_4_ * auVar87._12_4_;
      auVar25._16_4_ = auVar181._16_4_ * auVar87._16_4_;
      auVar25._20_4_ = auVar181._20_4_ * auVar87._20_4_;
      auVar25._24_4_ = auVar181._24_4_ * auVar87._24_4_;
      auVar25._28_4_ = auVar87._28_4_;
      auVar87 = vmaxps_avx(auVar25,local_1620);
      auVar78 = vmaxps_avx(auVar78,auVar87);
      auVar87 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + uVar68),local_1680);
      auVar26._4_4_ = auVar196._4_4_ * auVar87._4_4_;
      auVar26._0_4_ = auVar196._0_4_ * auVar87._0_4_;
      auVar26._8_4_ = auVar196._8_4_ * auVar87._8_4_;
      auVar26._12_4_ = auVar196._12_4_ * auVar87._12_4_;
      auVar26._16_4_ = auVar196._16_4_ * auVar87._16_4_;
      auVar26._20_4_ = auVar196._20_4_ * auVar87._20_4_;
      auVar26._24_4_ = auVar196._24_4_ * auVar87._24_4_;
      auVar26._28_4_ = auVar87._28_4_;
      auVar87 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + (uVar69 ^ 0x20)),local_16a0);
      auVar27._4_4_ = auVar204._4_4_ * auVar87._4_4_;
      auVar27._0_4_ = auVar204._0_4_ * auVar87._0_4_;
      auVar27._8_4_ = auVar204._8_4_ * auVar87._8_4_;
      auVar27._12_4_ = auVar204._12_4_ * auVar87._12_4_;
      auVar27._16_4_ = auVar204._16_4_ * auVar87._16_4_;
      auVar27._20_4_ = auVar204._20_4_ * auVar87._20_4_;
      auVar27._24_4_ = auVar204._24_4_ * auVar87._24_4_;
      auVar27._28_4_ = auVar87._28_4_;
      auVar87 = vminps_avx(auVar26,auVar27);
      auVar122 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + (uVar75 ^ 0x20)),local_16c0);
      auVar28._4_4_ = auVar206._4_4_ * auVar122._4_4_;
      auVar28._0_4_ = auVar206._0_4_ * auVar122._0_4_;
      auVar28._8_4_ = auVar206._8_4_ * auVar122._8_4_;
      auVar28._12_4_ = auVar206._12_4_ * auVar122._12_4_;
      auVar28._16_4_ = auVar206._16_4_ * auVar122._16_4_;
      auVar28._20_4_ = auVar206._20_4_ * auVar122._20_4_;
      auVar28._24_4_ = auVar206._24_4_ * auVar122._24_4_;
      auVar28._28_4_ = auVar122._28_4_;
      auVar122 = vminps_avx(auVar28,local_1640);
      auVar87 = vminps_avx(auVar87,auVar122);
      auVar78 = vcmpps_avx(auVar78,auVar87,2);
      uVar67 = vmovmskps_avx(auVar78);
      if (uVar67 == 0) goto LAB_00473e8c;
      uVar67 = uVar67 & 0xff;
      uVar64 = uVar74 & 0xfffffffffffffff0;
      lVar71 = 0;
      if (uVar67 != 0) {
        for (; (uVar67 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
        }
      }
      uVar74 = *(ulong *)(uVar64 + lVar71 * 8);
      uVar67 = uVar67 - 1 & uVar67;
      if (uVar67 != 0) {
        *puVar72 = uVar74;
        puVar72 = puVar72 + 1;
        lVar71 = 0;
        if (uVar67 != 0) {
          for (; (uVar67 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
          }
        }
        uVar74 = *(ulong *)(uVar64 + lVar71 * 8);
        uVar67 = uVar67 - 1 & uVar67;
        uVar70 = (ulong)uVar67;
        if (uVar67 != 0) {
          do {
            *puVar72 = uVar74;
            puVar72 = puVar72 + 1;
            lVar71 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
              }
            }
            uVar74 = *(ulong *)(uVar64 + lVar71 * 8);
            uVar70 = uVar70 & uVar70 - 1;
          } while (uVar70 != 0);
        }
      }
    }
    lVar71 = (ulong)((uint)uVar74 & 0xf) - 8;
    if (lVar71 != 0) {
      uVar74 = uVar74 & 0xfffffffffffffff0;
      local_1908 = 0;
      local_16e0 = auVar168._0_32_;
      local_1700 = auVar171._0_32_;
      local_1720 = auVar181._0_32_;
      local_1740 = auVar196._0_32_;
      local_1760 = auVar204._0_32_;
      local_1780 = auVar206._0_32_;
      local_1660 = auVar125._0_32_;
      do {
        lVar65 = local_1908 * 0xe0;
        lVar1 = uVar74 + 0xd0 + lVar65;
        local_1520 = *(undefined8 *)(lVar1 + 0x10);
        uStack_1518 = *(undefined8 *)(lVar1 + 0x18);
        lVar1 = uVar74 + 0xc0 + lVar65;
        local_1500 = *(undefined8 *)(lVar1 + 0x10);
        uStack_14f8 = *(undefined8 *)(lVar1 + 0x18);
        uStack_14f0 = local_1500;
        uStack_14e8 = uStack_14f8;
        uStack_1510 = local_1520;
        uStack_1508 = uStack_1518;
        auVar79._16_16_ = *(undefined1 (*) [16])(uVar74 + 0x60 + lVar65);
        auVar79._0_16_ = *(undefined1 (*) [16])(uVar74 + lVar65);
        auVar88._16_16_ = *(undefined1 (*) [16])(uVar74 + 0x70 + lVar65);
        auVar88._0_16_ = *(undefined1 (*) [16])(uVar74 + 0x10 + lVar65);
        auVar98._16_16_ = *(undefined1 (*) [16])(uVar74 + 0x80 + lVar65);
        auVar98._0_16_ = *(undefined1 (*) [16])(uVar74 + 0x20 + lVar65);
        auVar77 = *(undefined1 (*) [16])(uVar74 + 0x30 + lVar65);
        auVar123._16_16_ = auVar77;
        auVar123._0_16_ = auVar77;
        auVar77 = *(undefined1 (*) [16])(uVar74 + 0x40 + lVar65);
        auVar136._16_16_ = auVar77;
        auVar136._0_16_ = auVar77;
        auVar77 = *(undefined1 (*) [16])(uVar74 + 0x50 + lVar65);
        auVar150._16_16_ = auVar77;
        auVar150._0_16_ = auVar77;
        auVar77 = *(undefined1 (*) [16])(uVar74 + 0x90 + lVar65);
        auVar153._16_16_ = auVar77;
        auVar153._0_16_ = auVar77;
        auVar77 = *(undefined1 (*) [16])(uVar74 + 0xa0 + lVar65);
        auVar158._16_16_ = auVar77;
        auVar158._0_16_ = auVar77;
        auVar4 = *(undefined1 (*) [16])(uVar74 + 0xb0 + lVar65);
        auVar167._16_16_ = auVar4;
        auVar167._0_16_ = auVar4;
        uVar2 = *(undefined4 *)(ray + k * 4);
        auVar170._4_4_ = uVar2;
        auVar170._0_4_ = uVar2;
        auVar170._8_4_ = uVar2;
        auVar170._12_4_ = uVar2;
        auVar170._16_4_ = uVar2;
        auVar170._20_4_ = uVar2;
        auVar170._24_4_ = uVar2;
        auVar170._28_4_ = uVar2;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar180._4_4_ = uVar2;
        auVar180._0_4_ = uVar2;
        auVar180._8_4_ = uVar2;
        auVar180._12_4_ = uVar2;
        auVar180._16_4_ = uVar2;
        auVar180._20_4_ = uVar2;
        auVar180._24_4_ = uVar2;
        auVar180._28_4_ = uVar2;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar203._4_4_ = uVar2;
        auVar203._0_4_ = uVar2;
        auVar203._8_4_ = uVar2;
        auVar203._12_4_ = uVar2;
        auVar203._16_4_ = uVar2;
        auVar203._20_4_ = uVar2;
        auVar203._24_4_ = uVar2;
        auVar203._28_4_ = uVar2;
        auVar78 = vsubps_avx(auVar79,auVar170);
        local_1800 = vsubps_avx(auVar88,auVar180);
        local_1820 = vsubps_avx(auVar98,auVar203);
        auVar87 = vsubps_avx(auVar123,auVar170);
        auVar122 = vsubps_avx(auVar136,auVar180);
        auVar23 = vsubps_avx(auVar150,auVar203);
        auVar24 = vsubps_avx(auVar153,auVar170);
        auVar25 = vsubps_avx(auVar158,auVar180);
        auVar26 = vsubps_avx(auVar167,auVar203);
        local_1840 = vsubps_avx(auVar24,auVar78);
        local_1860 = vsubps_avx(auVar25,local_1800);
        local_1560 = vsubps_avx(auVar26,local_1820);
        fVar8 = local_1800._0_4_;
        fVar120 = auVar25._0_4_ + fVar8;
        fVar11 = local_1800._4_4_;
        fVar126 = auVar25._4_4_ + fVar11;
        fVar93 = local_1800._8_4_;
        fVar128 = auVar25._8_4_ + fVar93;
        fVar96 = local_1800._12_4_;
        fVar129 = auVar25._12_4_ + fVar96;
        fVar13 = local_1800._16_4_;
        fVar130 = auVar25._16_4_ + fVar13;
        fVar16 = local_1800._20_4_;
        fVar131 = auVar25._20_4_ + fVar16;
        fVar19 = local_1800._24_4_;
        fVar132 = auVar25._24_4_ + fVar19;
        fVar9 = local_1820._0_4_;
        fVar133 = auVar26._0_4_ + fVar9;
        fVar91 = local_1820._4_4_;
        fVar137 = auVar26._4_4_ + fVar91;
        fVar94 = local_1820._8_4_;
        fVar140 = auVar26._8_4_ + fVar94;
        fVar97 = local_1820._12_4_;
        fVar142 = auVar26._12_4_ + fVar97;
        fVar14 = local_1820._16_4_;
        fVar144 = auVar26._16_4_ + fVar14;
        fVar17 = local_1820._20_4_;
        fVar146 = auVar26._20_4_ + fVar17;
        fVar20 = local_1820._24_4_;
        fVar148 = auVar26._24_4_ + fVar20;
        fVar157 = local_1820._28_4_;
        fVar82 = local_1560._0_4_;
        fVar83 = local_1560._4_4_;
        auVar29._4_4_ = fVar126 * fVar83;
        auVar29._0_4_ = fVar120 * fVar82;
        fVar84 = local_1560._8_4_;
        auVar29._8_4_ = fVar128 * fVar84;
        fVar85 = local_1560._12_4_;
        auVar29._12_4_ = fVar129 * fVar85;
        fVar86 = local_1560._16_4_;
        auVar29._16_4_ = fVar130 * fVar86;
        fVar135 = local_1560._20_4_;
        auVar29._20_4_ = fVar131 * fVar135;
        fVar139 = local_1560._24_4_;
        auVar29._24_4_ = fVar132 * fVar139;
        auVar29._28_4_ = auVar77._12_4_;
        fVar178 = local_1860._0_4_;
        fVar182 = local_1860._4_4_;
        auVar30._4_4_ = fVar182 * fVar137;
        auVar30._0_4_ = fVar178 * fVar133;
        fVar184 = local_1860._8_4_;
        auVar30._8_4_ = fVar184 * fVar140;
        fVar186 = local_1860._12_4_;
        auVar30._12_4_ = fVar186 * fVar142;
        fVar188 = local_1860._16_4_;
        auVar30._16_4_ = fVar188 * fVar144;
        fVar190 = local_1860._20_4_;
        auVar30._20_4_ = fVar190 * fVar146;
        fVar192 = local_1860._24_4_;
        auVar30._24_4_ = fVar192 * fVar148;
        auVar30._28_4_ = auVar4._12_4_;
        auVar27 = vsubps_avx(auVar30,auVar29);
        fVar10 = auVar78._0_4_;
        fVar156 = auVar24._0_4_ + fVar10;
        fVar92 = auVar78._4_4_;
        fVar161 = auVar24._4_4_ + fVar92;
        fVar95 = auVar78._8_4_;
        fVar162 = auVar24._8_4_ + fVar95;
        fVar12 = auVar78._12_4_;
        fVar163 = auVar24._12_4_ + fVar12;
        fVar15 = auVar78._16_4_;
        fVar164 = auVar24._16_4_ + fVar15;
        fVar18 = auVar78._20_4_;
        fVar165 = auVar24._20_4_ + fVar18;
        fVar21 = auVar78._24_4_;
        fVar166 = auVar24._24_4_ + fVar21;
        fVar169 = local_1840._0_4_;
        fVar172 = local_1840._4_4_;
        auVar31._4_4_ = fVar172 * fVar137;
        auVar31._0_4_ = fVar169 * fVar133;
        fVar173 = local_1840._8_4_;
        auVar31._8_4_ = fVar173 * fVar140;
        fVar174 = local_1840._12_4_;
        auVar31._12_4_ = fVar174 * fVar142;
        fVar175 = local_1840._16_4_;
        auVar31._16_4_ = fVar175 * fVar144;
        fVar176 = local_1840._20_4_;
        auVar31._20_4_ = fVar176 * fVar146;
        fVar177 = local_1840._24_4_;
        auVar31._24_4_ = fVar177 * fVar148;
        auVar31._28_4_ = auVar26._28_4_ + fVar157;
        auVar32._4_4_ = fVar161 * fVar83;
        auVar32._0_4_ = fVar156 * fVar82;
        auVar32._8_4_ = fVar162 * fVar84;
        auVar32._12_4_ = fVar163 * fVar85;
        auVar32._16_4_ = fVar164 * fVar86;
        auVar32._20_4_ = fVar165 * fVar135;
        auVar32._24_4_ = fVar166 * fVar139;
        auVar32._28_4_ = auVar4._12_4_;
        auVar28 = vsubps_avx(auVar32,auVar31);
        auVar33._4_4_ = fVar161 * fVar182;
        auVar33._0_4_ = fVar156 * fVar178;
        auVar33._8_4_ = fVar162 * fVar184;
        auVar33._12_4_ = fVar163 * fVar186;
        auVar33._16_4_ = fVar164 * fVar188;
        auVar33._20_4_ = fVar165 * fVar190;
        auVar33._24_4_ = fVar166 * fVar192;
        auVar33._28_4_ = auVar24._28_4_ + auVar78._28_4_;
        auVar34._4_4_ = fVar172 * fVar126;
        auVar34._0_4_ = fVar169 * fVar120;
        auVar34._8_4_ = fVar173 * fVar128;
        auVar34._12_4_ = fVar174 * fVar129;
        auVar34._16_4_ = fVar175 * fVar130;
        auVar34._20_4_ = fVar176 * fVar131;
        auVar34._24_4_ = fVar177 * fVar132;
        auVar34._28_4_ = auVar25._28_4_ + local_1800._28_4_;
        auVar29 = vsubps_avx(auVar34,auVar33);
        fVar120 = *(float *)(ray + k * 4 + 0xa0);
        fVar126 = *(float *)(ray + k * 4 + 0xc0);
        fVar128 = *(float *)(ray + k * 4 + 0x80);
        local_17e0._0_4_ =
             auVar27._0_4_ * fVar128 + auVar29._0_4_ * fVar126 + fVar120 * auVar28._0_4_;
        local_17e0._4_4_ =
             auVar27._4_4_ * fVar128 + auVar29._4_4_ * fVar126 + fVar120 * auVar28._4_4_;
        local_17e0._8_4_ =
             auVar27._8_4_ * fVar128 + auVar29._8_4_ * fVar126 + fVar120 * auVar28._8_4_;
        local_17e0._12_4_ =
             auVar27._12_4_ * fVar128 + auVar29._12_4_ * fVar126 + fVar120 * auVar28._12_4_;
        local_17e0._16_4_ =
             auVar27._16_4_ * fVar128 + auVar29._16_4_ * fVar126 + fVar120 * auVar28._16_4_;
        local_17e0._20_4_ =
             auVar27._20_4_ * fVar128 + auVar29._20_4_ * fVar126 + fVar120 * auVar28._20_4_;
        local_17e0._24_4_ =
             auVar27._24_4_ * fVar128 + auVar29._24_4_ * fVar126 + fVar120 * auVar28._24_4_;
        local_17e0._28_4_ = auVar28._28_4_ + auVar29._28_4_ + auVar28._28_4_;
        local_1580 = vsubps_avx(local_1800,auVar122);
        auVar28 = vsubps_avx(local_1820,auVar23);
        fVar144 = fVar8 + auVar122._0_4_;
        fVar146 = fVar11 + auVar122._4_4_;
        fVar148 = fVar93 + auVar122._8_4_;
        fVar156 = fVar96 + auVar122._12_4_;
        fVar161 = fVar13 + auVar122._16_4_;
        fVar162 = fVar16 + auVar122._20_4_;
        fVar163 = fVar19 + auVar122._24_4_;
        fVar129 = auVar122._28_4_;
        fVar130 = auVar23._0_4_ + fVar9;
        fVar131 = auVar23._4_4_ + fVar91;
        fVar132 = auVar23._8_4_ + fVar94;
        fVar133 = auVar23._12_4_ + fVar97;
        fVar137 = auVar23._16_4_ + fVar14;
        fVar140 = auVar23._20_4_ + fVar17;
        fVar142 = auVar23._24_4_ + fVar20;
        fVar155 = auVar23._28_4_;
        fVar195 = auVar28._0_4_;
        fVar197 = auVar28._4_4_;
        auVar35._4_4_ = fVar197 * fVar146;
        auVar35._0_4_ = fVar195 * fVar144;
        fVar198 = auVar28._8_4_;
        auVar35._8_4_ = fVar198 * fVar148;
        fVar199 = auVar28._12_4_;
        auVar35._12_4_ = fVar199 * fVar156;
        fVar200 = auVar28._16_4_;
        auVar35._16_4_ = fVar200 * fVar161;
        fVar201 = auVar28._20_4_;
        auVar35._20_4_ = fVar201 * fVar162;
        fVar202 = auVar28._24_4_;
        auVar35._24_4_ = fVar202 * fVar163;
        auVar35._28_4_ = auVar27._28_4_;
        fVar134 = local_1580._0_4_;
        fVar138 = local_1580._4_4_;
        auVar36._4_4_ = fVar138 * fVar131;
        auVar36._0_4_ = fVar134 * fVar130;
        fVar141 = local_1580._8_4_;
        auVar36._8_4_ = fVar141 * fVar132;
        fVar143 = local_1580._12_4_;
        auVar36._12_4_ = fVar143 * fVar133;
        fVar145 = local_1580._16_4_;
        auVar36._16_4_ = fVar145 * fVar137;
        fVar147 = local_1580._20_4_;
        auVar36._20_4_ = fVar147 * fVar140;
        fVar149 = local_1580._24_4_;
        auVar36._24_4_ = fVar149 * fVar142;
        auVar36._28_4_ = fVar157;
        auVar27 = vsubps_avx(auVar36,auVar35);
        auVar28 = vsubps_avx(auVar78,auVar87);
        fVar205 = auVar28._0_4_;
        fVar207 = auVar28._4_4_;
        auVar37._4_4_ = fVar207 * fVar131;
        auVar37._0_4_ = fVar205 * fVar130;
        fVar208 = auVar28._8_4_;
        auVar37._8_4_ = fVar208 * fVar132;
        fVar209 = auVar28._12_4_;
        auVar37._12_4_ = fVar209 * fVar133;
        fVar210 = auVar28._16_4_;
        auVar37._16_4_ = fVar210 * fVar137;
        fVar211 = auVar28._20_4_;
        auVar37._20_4_ = fVar211 * fVar140;
        fVar212 = auVar28._24_4_;
        auVar37._24_4_ = fVar212 * fVar142;
        auVar37._28_4_ = fVar155 + fVar157;
        fVar157 = auVar87._0_4_ + fVar10;
        fVar130 = auVar87._4_4_ + fVar92;
        fVar131 = auVar87._8_4_ + fVar95;
        fVar132 = auVar87._12_4_ + fVar12;
        fVar133 = auVar87._16_4_ + fVar15;
        fVar137 = auVar87._20_4_ + fVar18;
        fVar140 = auVar87._24_4_ + fVar21;
        fVar194 = auVar87._28_4_;
        auVar38._4_4_ = fVar130 * fVar197;
        auVar38._0_4_ = fVar157 * fVar195;
        auVar38._8_4_ = fVar131 * fVar198;
        auVar38._12_4_ = fVar132 * fVar199;
        auVar38._16_4_ = fVar133 * fVar200;
        auVar38._20_4_ = fVar137 * fVar201;
        auVar38._24_4_ = fVar140 * fVar202;
        auVar38._28_4_ = fVar194;
        auVar28 = vsubps_avx(auVar38,auVar37);
        auVar39._4_4_ = fVar130 * fVar138;
        auVar39._0_4_ = fVar157 * fVar134;
        auVar39._8_4_ = fVar131 * fVar141;
        auVar39._12_4_ = fVar132 * fVar143;
        auVar39._16_4_ = fVar133 * fVar145;
        auVar39._20_4_ = fVar137 * fVar147;
        auVar39._24_4_ = fVar140 * fVar149;
        auVar39._28_4_ = fVar194 + auVar78._28_4_;
        auVar40._4_4_ = fVar207 * fVar146;
        auVar40._0_4_ = fVar205 * fVar144;
        auVar40._8_4_ = fVar208 * fVar148;
        auVar40._12_4_ = fVar209 * fVar156;
        auVar40._16_4_ = fVar210 * fVar161;
        auVar40._20_4_ = fVar211 * fVar162;
        auVar40._24_4_ = fVar212 * fVar163;
        auVar40._28_4_ = local_1800._28_4_ + fVar129;
        auVar78 = vsubps_avx(auVar40,auVar39);
        local_15e0._0_4_ =
             fVar128 * auVar27._0_4_ + auVar78._0_4_ * fVar126 + fVar120 * auVar28._0_4_;
        local_15e0._4_4_ =
             fVar128 * auVar27._4_4_ + auVar78._4_4_ * fVar126 + fVar120 * auVar28._4_4_;
        local_15e0._8_4_ =
             fVar128 * auVar27._8_4_ + auVar78._8_4_ * fVar126 + fVar120 * auVar28._8_4_;
        local_15e0._12_4_ =
             fVar128 * auVar27._12_4_ + auVar78._12_4_ * fVar126 + fVar120 * auVar28._12_4_;
        local_15e0._16_4_ =
             fVar128 * auVar27._16_4_ + auVar78._16_4_ * fVar126 + fVar120 * auVar28._16_4_;
        local_15e0._20_4_ =
             fVar128 * auVar27._20_4_ + auVar78._20_4_ * fVar126 + fVar120 * auVar28._20_4_;
        local_15e0._24_4_ =
             fVar128 * auVar27._24_4_ + auVar78._24_4_ * fVar126 + fVar120 * auVar28._24_4_;
        local_15e0._28_4_ = auVar27._28_4_ + auVar78._28_4_ + auVar28._28_4_;
        auVar78 = vsubps_avx(auVar87,auVar24);
        fVar140 = auVar87._0_4_ + auVar24._0_4_;
        fVar142 = auVar87._4_4_ + auVar24._4_4_;
        fVar144 = auVar87._8_4_ + auVar24._8_4_;
        fVar146 = auVar87._12_4_ + auVar24._12_4_;
        fVar148 = auVar87._16_4_ + auVar24._16_4_;
        fVar156 = auVar87._20_4_ + auVar24._20_4_;
        fVar161 = auVar87._24_4_ + auVar24._24_4_;
        auVar27 = vsubps_avx(auVar122,auVar25);
        fVar162 = auVar122._0_4_ + auVar25._0_4_;
        fVar163 = auVar122._4_4_ + auVar25._4_4_;
        fVar164 = auVar122._8_4_ + auVar25._8_4_;
        fVar165 = auVar122._12_4_ + auVar25._12_4_;
        fVar166 = auVar122._16_4_ + auVar25._16_4_;
        fVar106 = auVar122._20_4_ + auVar25._20_4_;
        fVar107 = auVar122._24_4_ + auVar25._24_4_;
        fVar108 = fVar129 + auVar25._28_4_;
        auVar87 = vsubps_avx(auVar23,auVar26);
        fVar109 = auVar23._0_4_ + auVar26._0_4_;
        fVar114 = auVar23._4_4_ + auVar26._4_4_;
        fVar115 = auVar23._8_4_ + auVar26._8_4_;
        fVar116 = auVar23._12_4_ + auVar26._12_4_;
        fVar117 = auVar23._16_4_ + auVar26._16_4_;
        fVar118 = auVar23._20_4_ + auVar26._20_4_;
        fVar119 = auVar23._24_4_ + auVar26._24_4_;
        fVar179 = auVar87._0_4_;
        fVar183 = auVar87._4_4_;
        auVar41._4_4_ = fVar183 * fVar163;
        auVar41._0_4_ = fVar179 * fVar162;
        fVar185 = auVar87._8_4_;
        auVar41._8_4_ = fVar185 * fVar164;
        fVar187 = auVar87._12_4_;
        auVar41._12_4_ = fVar187 * fVar165;
        fVar189 = auVar87._16_4_;
        auVar41._16_4_ = fVar189 * fVar166;
        fVar191 = auVar87._20_4_;
        auVar41._20_4_ = fVar191 * fVar106;
        fVar193 = auVar87._24_4_;
        auVar41._24_4_ = fVar193 * fVar107;
        auVar41._28_4_ = fVar129;
        fVar157 = auVar27._0_4_;
        fVar129 = auVar27._4_4_;
        auVar42._4_4_ = fVar129 * fVar114;
        auVar42._0_4_ = fVar157 * fVar109;
        fVar130 = auVar27._8_4_;
        auVar42._8_4_ = fVar130 * fVar115;
        fVar131 = auVar27._12_4_;
        auVar42._12_4_ = fVar131 * fVar116;
        fVar132 = auVar27._16_4_;
        auVar42._16_4_ = fVar132 * fVar117;
        fVar133 = auVar27._20_4_;
        auVar42._20_4_ = fVar133 * fVar118;
        fVar137 = auVar27._24_4_;
        auVar42._24_4_ = fVar137 * fVar119;
        auVar42._28_4_ = fVar155;
        auVar87 = vsubps_avx(auVar42,auVar41);
        fVar121 = auVar78._0_4_;
        fVar127 = auVar78._4_4_;
        auVar43._4_4_ = fVar127 * fVar114;
        auVar43._0_4_ = fVar121 * fVar109;
        fVar109 = auVar78._8_4_;
        auVar43._8_4_ = fVar109 * fVar115;
        fVar114 = auVar78._12_4_;
        auVar43._12_4_ = fVar114 * fVar116;
        fVar115 = auVar78._16_4_;
        auVar43._16_4_ = fVar115 * fVar117;
        fVar116 = auVar78._20_4_;
        auVar43._20_4_ = fVar116 * fVar118;
        fVar117 = auVar78._24_4_;
        auVar43._24_4_ = fVar117 * fVar119;
        auVar43._28_4_ = fVar155 + auVar26._28_4_;
        auVar44._4_4_ = fVar183 * fVar142;
        auVar44._0_4_ = fVar179 * fVar140;
        auVar44._8_4_ = fVar185 * fVar144;
        auVar44._12_4_ = fVar187 * fVar146;
        auVar44._16_4_ = fVar189 * fVar148;
        auVar44._20_4_ = fVar191 * fVar156;
        auVar44._24_4_ = fVar193 * fVar161;
        auVar44._28_4_ = fVar155;
        auVar78 = vsubps_avx(auVar44,auVar43);
        auVar45._4_4_ = fVar142 * fVar129;
        auVar45._0_4_ = fVar140 * fVar157;
        auVar45._8_4_ = fVar144 * fVar130;
        auVar45._12_4_ = fVar146 * fVar131;
        auVar45._16_4_ = fVar148 * fVar132;
        auVar45._20_4_ = fVar156 * fVar133;
        auVar45._24_4_ = fVar161 * fVar137;
        auVar45._28_4_ = fVar194 + auVar24._28_4_;
        auVar46._4_4_ = fVar127 * fVar163;
        auVar46._0_4_ = fVar121 * fVar162;
        auVar46._8_4_ = fVar109 * fVar164;
        auVar46._12_4_ = fVar114 * fVar165;
        auVar46._16_4_ = fVar115 * fVar166;
        auVar46._20_4_ = fVar116 * fVar106;
        auVar46._24_4_ = fVar117 * fVar107;
        auVar46._28_4_ = fVar108;
        auVar122 = vsubps_avx(auVar46,auVar45);
        auVar99._0_4_ = fVar128 * auVar87._0_4_ + auVar122._0_4_ * fVar126 + fVar120 * auVar78._0_4_
        ;
        auVar99._4_4_ = fVar128 * auVar87._4_4_ + auVar122._4_4_ * fVar126 + fVar120 * auVar78._4_4_
        ;
        auVar99._8_4_ = fVar128 * auVar87._8_4_ + auVar122._8_4_ * fVar126 + fVar120 * auVar78._8_4_
        ;
        auVar99._12_4_ =
             fVar128 * auVar87._12_4_ + auVar122._12_4_ * fVar126 + fVar120 * auVar78._12_4_;
        auVar99._16_4_ =
             fVar128 * auVar87._16_4_ + auVar122._16_4_ * fVar126 + fVar120 * auVar78._16_4_;
        auVar99._20_4_ =
             fVar128 * auVar87._20_4_ + auVar122._20_4_ * fVar126 + fVar120 * auVar78._20_4_;
        auVar99._24_4_ =
             fVar128 * auVar87._24_4_ + auVar122._24_4_ * fVar126 + fVar120 * auVar78._24_4_;
        auVar99._28_4_ = fVar108 + auVar122._28_4_ + fVar108;
        local_15a0._0_4_ = auVar99._0_4_ + local_17e0._0_4_ + local_15e0._0_4_;
        local_15a0._4_4_ = auVar99._4_4_ + local_17e0._4_4_ + local_15e0._4_4_;
        local_15a0._8_4_ = auVar99._8_4_ + local_17e0._8_4_ + local_15e0._8_4_;
        local_15a0._12_4_ = auVar99._12_4_ + local_17e0._12_4_ + local_15e0._12_4_;
        local_15a0._16_4_ = auVar99._16_4_ + local_17e0._16_4_ + local_15e0._16_4_;
        local_15a0._20_4_ = auVar99._20_4_ + local_17e0._20_4_ + local_15e0._20_4_;
        local_15a0._24_4_ = auVar99._24_4_ + local_17e0._24_4_ + local_15e0._24_4_;
        local_15a0._28_4_ = auVar99._28_4_ + local_17e0._28_4_ + local_15e0._28_4_;
        auVar78 = vminps_avx(local_17e0,local_15e0);
        auVar78 = vminps_avx(auVar78,auVar99);
        auVar110._8_4_ = 0x7fffffff;
        auVar110._0_8_ = 0x7fffffff7fffffff;
        auVar110._12_4_ = 0x7fffffff;
        auVar110._16_4_ = 0x7fffffff;
        auVar110._20_4_ = 0x7fffffff;
        auVar110._24_4_ = 0x7fffffff;
        auVar110._28_4_ = 0x7fffffff;
        local_15c0 = vandps_avx(local_15a0,auVar110);
        fVar140 = local_15c0._0_4_ * 1.1920929e-07;
        fVar142 = local_15c0._4_4_ * 1.1920929e-07;
        auVar47._4_4_ = fVar142;
        auVar47._0_4_ = fVar140;
        fVar144 = local_15c0._8_4_ * 1.1920929e-07;
        auVar47._8_4_ = fVar144;
        fVar146 = local_15c0._12_4_ * 1.1920929e-07;
        auVar47._12_4_ = fVar146;
        fVar148 = local_15c0._16_4_ * 1.1920929e-07;
        auVar47._16_4_ = fVar148;
        fVar156 = local_15c0._20_4_ * 1.1920929e-07;
        auVar47._20_4_ = fVar156;
        fVar161 = local_15c0._24_4_ * 1.1920929e-07;
        auVar47._24_4_ = fVar161;
        auVar47._28_4_ = 0x34000000;
        auVar151._0_8_ = CONCAT44(fVar142,fVar140) ^ 0x8000000080000000;
        auVar151._8_4_ = -fVar144;
        auVar151._12_4_ = -fVar146;
        auVar151._16_4_ = -fVar148;
        auVar151._20_4_ = -fVar156;
        auVar151._24_4_ = -fVar161;
        auVar151._28_4_ = 0xb4000000;
        auVar78 = vcmpps_avx(auVar78,auVar151,5);
        auVar122 = vmaxps_avx(local_17e0,local_15e0);
        auVar87 = vmaxps_avx(auVar122,auVar99);
        auVar87 = vcmpps_avx(auVar87,auVar47,2);
        auVar87 = vorps_avx(auVar78,auVar87);
        if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar87 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar87 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar87 >> 0x7f,0) == '\0') &&
              (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar87 >> 0xbf,0) == '\0') &&
            (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar87[0x1f]) {
LAB_00473e0a:
          auVar152 = ZEXT3264(local_1680);
          auVar154 = ZEXT3264(local_16a0);
          auVar160 = ZEXT3264(local_16c0);
          auVar168 = ZEXT3264(local_16e0);
          auVar171 = ZEXT3264(local_1700);
          auVar181 = ZEXT3264(local_1720);
          auVar196 = ZEXT3264(local_1740);
          auVar204 = ZEXT3264(local_1760);
          auVar206 = ZEXT3264(local_1780);
          auVar105 = ZEXT3264(local_1620);
          auVar113 = ZEXT3264(local_1640);
          auVar125 = ZEXT3264(local_1660);
        }
        else {
          auVar48._4_4_ = fVar138 * fVar83;
          auVar48._0_4_ = fVar134 * fVar82;
          auVar48._8_4_ = fVar141 * fVar84;
          auVar48._12_4_ = fVar143 * fVar85;
          auVar48._16_4_ = fVar145 * fVar86;
          auVar48._20_4_ = fVar147 * fVar135;
          auVar48._24_4_ = fVar149 * fVar139;
          auVar48._28_4_ = auVar78._28_4_;
          auVar49._4_4_ = fVar182 * fVar197;
          auVar49._0_4_ = fVar178 * fVar195;
          auVar49._8_4_ = fVar184 * fVar198;
          auVar49._12_4_ = fVar186 * fVar199;
          auVar49._16_4_ = fVar188 * fVar200;
          auVar49._20_4_ = fVar190 * fVar201;
          auVar49._24_4_ = fVar192 * fVar202;
          auVar49._28_4_ = 0x34000000;
          auVar23 = vsubps_avx(auVar49,auVar48);
          auVar50._4_4_ = fVar197 * fVar129;
          auVar50._0_4_ = fVar195 * fVar157;
          auVar50._8_4_ = fVar198 * fVar130;
          auVar50._12_4_ = fVar199 * fVar131;
          auVar50._16_4_ = fVar200 * fVar132;
          auVar50._20_4_ = fVar201 * fVar133;
          auVar50._24_4_ = fVar202 * fVar137;
          auVar50._28_4_ = auVar122._28_4_;
          auVar51._4_4_ = fVar138 * fVar183;
          auVar51._0_4_ = fVar134 * fVar179;
          auVar51._8_4_ = fVar141 * fVar185;
          auVar51._12_4_ = fVar143 * fVar187;
          auVar51._16_4_ = fVar145 * fVar189;
          auVar51._20_4_ = fVar147 * fVar191;
          auVar51._24_4_ = fVar149 * fVar193;
          auVar51._28_4_ = fVar155;
          auVar24 = vsubps_avx(auVar51,auVar50);
          auVar159._8_4_ = 0x7fffffff;
          auVar159._0_8_ = 0x7fffffff7fffffff;
          auVar159._12_4_ = 0x7fffffff;
          auVar159._16_4_ = 0x7fffffff;
          auVar159._20_4_ = 0x7fffffff;
          auVar159._24_4_ = 0x7fffffff;
          auVar159._28_4_ = 0x7fffffff;
          auVar78 = vandps_avx(auVar159,auVar48);
          auVar122 = vandps_avx(auVar159,auVar50);
          auVar78 = vcmpps_avx(auVar78,auVar122,1);
          local_1480 = vblendvps_avx(auVar24,auVar23,auVar78);
          auVar52._4_4_ = fVar207 * fVar183;
          auVar52._0_4_ = fVar205 * fVar179;
          auVar52._8_4_ = fVar208 * fVar185;
          auVar52._12_4_ = fVar209 * fVar187;
          auVar52._16_4_ = fVar210 * fVar189;
          auVar52._20_4_ = fVar211 * fVar191;
          auVar52._24_4_ = fVar212 * fVar193;
          auVar52._28_4_ = fVar126;
          auVar53._4_4_ = fVar207 * fVar83;
          auVar53._0_4_ = fVar205 * fVar82;
          auVar53._8_4_ = fVar208 * fVar84;
          auVar53._12_4_ = fVar209 * fVar85;
          auVar53._16_4_ = fVar210 * fVar86;
          auVar53._20_4_ = fVar211 * fVar135;
          auVar53._24_4_ = fVar212 * fVar139;
          auVar53._28_4_ = auVar78._28_4_;
          auVar54._4_4_ = fVar197 * fVar172;
          auVar54._0_4_ = fVar195 * fVar169;
          auVar54._8_4_ = fVar198 * fVar173;
          auVar54._12_4_ = fVar199 * fVar174;
          auVar54._16_4_ = fVar200 * fVar175;
          auVar54._20_4_ = fVar201 * fVar176;
          auVar54._24_4_ = fVar202 * fVar177;
          auVar54._28_4_ = auVar23._28_4_;
          auVar23 = vsubps_avx(auVar53,auVar54);
          auVar55._4_4_ = fVar197 * fVar127;
          auVar55._0_4_ = fVar195 * fVar121;
          auVar55._8_4_ = fVar198 * fVar109;
          auVar55._12_4_ = fVar199 * fVar114;
          auVar55._16_4_ = fVar200 * fVar115;
          auVar55._20_4_ = fVar201 * fVar116;
          auVar55._24_4_ = fVar202 * fVar117;
          auVar55._28_4_ = fVar128;
          auVar24 = vsubps_avx(auVar55,auVar52);
          auVar78 = vandps_avx(auVar159,auVar54);
          auVar122 = vandps_avx(auVar159,auVar52);
          auVar122 = vcmpps_avx(auVar78,auVar122,1);
          local_1460 = vblendvps_avx(auVar24,auVar23,auVar122);
          auVar56._4_4_ = fVar138 * fVar127;
          auVar56._0_4_ = fVar134 * fVar121;
          auVar56._8_4_ = fVar141 * fVar109;
          auVar56._12_4_ = fVar143 * fVar114;
          auVar56._16_4_ = fVar145 * fVar115;
          auVar56._20_4_ = fVar147 * fVar116;
          auVar56._24_4_ = fVar149 * fVar117;
          auVar56._28_4_ = auVar122._28_4_;
          auVar57._4_4_ = fVar138 * fVar172;
          auVar57._0_4_ = fVar134 * fVar169;
          auVar57._8_4_ = fVar141 * fVar173;
          auVar57._12_4_ = fVar143 * fVar174;
          auVar57._16_4_ = fVar145 * fVar175;
          auVar57._20_4_ = fVar147 * fVar176;
          auVar57._24_4_ = fVar149 * fVar177;
          auVar57._28_4_ = auVar23._28_4_;
          auVar58._4_4_ = fVar207 * fVar182;
          auVar58._0_4_ = fVar205 * fVar178;
          auVar58._8_4_ = fVar208 * fVar184;
          auVar58._12_4_ = fVar209 * fVar186;
          auVar58._16_4_ = fVar210 * fVar188;
          auVar58._20_4_ = fVar211 * fVar190;
          auVar58._24_4_ = fVar212 * fVar192;
          auVar58._28_4_ = auVar78._28_4_;
          auVar59._4_4_ = fVar207 * fVar129;
          auVar59._0_4_ = fVar205 * fVar157;
          auVar59._8_4_ = fVar208 * fVar130;
          auVar59._12_4_ = fVar209 * fVar131;
          auVar59._16_4_ = fVar210 * fVar132;
          auVar59._20_4_ = fVar211 * fVar133;
          auVar59._24_4_ = fVar212 * fVar137;
          auVar59._28_4_ = auVar27._28_4_;
          auVar23 = vsubps_avx(auVar57,auVar58);
          auVar24 = vsubps_avx(auVar59,auVar56);
          auVar78 = vandps_avx(auVar159,auVar58);
          auVar122 = vandps_avx(auVar159,auVar56);
          auVar122 = vcmpps_avx(auVar78,auVar122,1);
          local_1440 = vblendvps_avx(auVar24,auVar23,auVar122);
          auVar77 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
          fVar135 = local_1440._0_4_;
          fVar139 = local_1440._4_4_;
          fVar130 = local_1440._8_4_;
          fVar131 = local_1440._12_4_;
          fVar132 = local_1440._16_4_;
          fVar133 = local_1440._20_4_;
          fVar137 = local_1440._24_4_;
          fVar162 = local_1460._0_4_;
          fVar163 = local_1460._4_4_;
          fVar164 = local_1460._8_4_;
          fVar165 = local_1460._12_4_;
          fVar166 = local_1460._16_4_;
          fVar106 = local_1460._20_4_;
          fVar157 = auVar122._28_4_;
          fVar107 = local_1460._24_4_;
          fVar140 = local_1480._0_4_;
          fVar142 = local_1480._4_4_;
          fVar144 = local_1480._8_4_;
          fVar146 = local_1480._12_4_;
          fVar148 = local_1480._16_4_;
          fVar156 = local_1480._20_4_;
          fVar161 = local_1480._24_4_;
          fVar129 = fVar140 * fVar128 + fVar135 * fVar126 + fVar162 * fVar120;
          fVar82 = fVar142 * fVar128 + fVar139 * fVar126 + fVar163 * fVar120;
          fVar83 = fVar144 * fVar128 + fVar130 * fVar126 + fVar164 * fVar120;
          fVar84 = fVar146 * fVar128 + fVar131 * fVar126 + fVar165 * fVar120;
          fVar85 = fVar148 * fVar128 + fVar132 * fVar126 + fVar166 * fVar120;
          fVar86 = fVar156 * fVar128 + fVar133 * fVar126 + fVar106 * fVar120;
          fVar120 = fVar161 * fVar128 + fVar137 * fVar126 + fVar107 * fVar120;
          fVar126 = fVar157 + fVar157 + 0.0;
          auVar80._0_4_ = fVar129 + fVar129;
          auVar80._4_4_ = fVar82 + fVar82;
          auVar80._8_4_ = fVar83 + fVar83;
          auVar80._12_4_ = fVar84 + fVar84;
          auVar80._16_4_ = fVar85 + fVar85;
          auVar80._20_4_ = fVar86 + fVar86;
          auVar80._24_4_ = fVar120 + fVar120;
          auVar80._28_4_ = fVar126 + fVar126;
          fVar129 = fVar140 * fVar10 + fVar135 * fVar9 + fVar162 * fVar8;
          fVar91 = fVar142 * fVar92 + fVar139 * fVar91 + fVar163 * fVar11;
          fVar92 = fVar144 * fVar95 + fVar130 * fVar94 + fVar164 * fVar93;
          fVar93 = fVar146 * fVar12 + fVar131 * fVar97 + fVar165 * fVar96;
          fVar94 = fVar148 * fVar15 + fVar132 * fVar14 + fVar166 * fVar13;
          fVar95 = fVar156 * fVar18 + fVar133 * fVar17 + fVar106 * fVar16;
          fVar96 = fVar161 * fVar21 + fVar137 * fVar20 + fVar107 * fVar19;
          fVar97 = auVar23._28_4_ + fVar157 + auVar23._28_4_;
          auVar87 = vrcpps_avx(auVar80);
          fVar120 = auVar87._0_4_;
          fVar126 = auVar87._4_4_;
          auVar60._4_4_ = auVar80._4_4_ * fVar126;
          auVar60._0_4_ = auVar80._0_4_ * fVar120;
          fVar128 = auVar87._8_4_;
          auVar60._8_4_ = auVar80._8_4_ * fVar128;
          fVar8 = auVar87._12_4_;
          auVar60._12_4_ = auVar80._12_4_ * fVar8;
          fVar9 = auVar87._16_4_;
          auVar60._16_4_ = auVar80._16_4_ * fVar9;
          fVar10 = auVar87._20_4_;
          auVar60._20_4_ = auVar80._20_4_ * fVar10;
          fVar11 = auVar87._24_4_;
          auVar60._24_4_ = auVar80._24_4_ * fVar11;
          auVar60._28_4_ = auVar78._28_4_;
          auVar124._8_4_ = 0x3f800000;
          auVar124._0_8_ = 0x3f8000003f800000;
          auVar124._12_4_ = 0x3f800000;
          auVar124._16_4_ = 0x3f800000;
          auVar124._20_4_ = 0x3f800000;
          auVar124._24_4_ = 0x3f800000;
          auVar124._28_4_ = 0x3f800000;
          auVar78 = vsubps_avx(auVar124,auVar60);
          local_13c0._4_4_ = (fVar91 + fVar91) * (fVar126 + fVar126 * auVar78._4_4_);
          local_13c0._0_4_ = (fVar129 + fVar129) * (fVar120 + fVar120 * auVar78._0_4_);
          local_13c0._8_4_ = (fVar92 + fVar92) * (fVar128 + fVar128 * auVar78._8_4_);
          local_13c0._12_4_ = (fVar93 + fVar93) * (fVar8 + fVar8 * auVar78._12_4_);
          local_13c0._16_4_ = (fVar94 + fVar94) * (fVar9 + fVar9 * auVar78._16_4_);
          local_13c0._20_4_ = (fVar95 + fVar95) * (fVar10 + fVar10 * auVar78._20_4_);
          local_13c0._24_4_ = (fVar96 + fVar96) * (fVar11 + fVar11 * auVar78._24_4_);
          local_13c0._28_4_ = fVar97 + fVar97;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar103._4_4_ = uVar2;
          auVar103._0_4_ = uVar2;
          auVar103._8_4_ = uVar2;
          auVar103._12_4_ = uVar2;
          auVar103._16_4_ = uVar2;
          auVar103._20_4_ = uVar2;
          auVar103._24_4_ = uVar2;
          auVar103._28_4_ = uVar2;
          auVar78 = vcmpps_avx(auVar103,local_13c0,2);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
          local_1600._4_4_ = uVar2;
          local_1600._0_4_ = uVar2;
          local_1600._8_4_ = uVar2;
          local_1600._12_4_ = uVar2;
          local_1600._16_4_ = uVar2;
          local_1600._20_4_ = uVar2;
          local_1600._24_4_ = uVar2;
          local_1600._28_4_ = uVar2;
          auVar87 = vcmpps_avx(local_13c0,local_1600,2);
          auVar78 = vandps_avx(auVar87,auVar78);
          auVar4 = vpackssdw_avx(auVar78._0_16_,auVar78._16_16_);
          auVar77 = vpand_avx(auVar4,auVar77);
          auVar4 = vpmovsxwd_avx(auVar77);
          auVar22 = vpshufd_avx(auVar77,0xee);
          auVar22 = vpmovsxwd_avx(auVar22);
          auVar104._16_16_ = auVar22;
          auVar104._0_16_ = auVar4;
          if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar104 >> 0x7f,0) == '\0') &&
                (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar22 >> 0x3f,0) == '\0') &&
              (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar22[0xf]) goto LAB_00473e0a;
          auVar78 = vcmpps_avx(auVar80,_DAT_01faff00,4);
          auVar4 = vpackssdw_avx(auVar78._0_16_,auVar78._16_16_);
          auVar77 = vpand_avx(auVar77,auVar4);
          auVar4 = vpmovsxwd_avx(auVar77);
          auVar22 = vpunpckhwd_avx(auVar77,auVar77);
          local_1420._16_16_ = auVar22;
          local_1420._0_16_ = auVar4;
          if ((((((((local_1420 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_1420 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_1420 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_1420 >> 0x7f,0) == '\0') &&
                (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar22 >> 0x3f,0) == '\0') &&
              (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar22[0xf]) goto LAB_00473e0a;
          local_14e0 = local_17e0._0_4_;
          fStack_14dc = local_17e0._4_4_;
          fStack_14d8 = local_17e0._8_4_;
          fStack_14d4 = local_17e0._12_4_;
          fStack_14d0 = local_17e0._16_4_;
          fStack_14cc = local_17e0._20_4_;
          fStack_14c8 = local_17e0._24_4_;
          fStack_14c4 = local_17e0._28_4_;
          local_14c0 = local_15e0._0_4_;
          fStack_14bc = local_15e0._4_4_;
          fStack_14b8 = local_15e0._8_4_;
          fStack_14b4 = local_15e0._12_4_;
          fStack_14b0 = local_15e0._16_4_;
          fStack_14ac = local_15e0._20_4_;
          fStack_14a8 = local_15e0._24_4_;
          fStack_14a4 = local_15e0._28_4_;
          local_14a0 = local_15a0;
          auVar125 = ZEXT3264(local_1660);
          local_1340 = local_1660;
          auVar78 = vrcpps_avx(local_15a0);
          pSVar5 = context->scene;
          fVar120 = auVar78._0_4_;
          fVar126 = auVar78._4_4_;
          auVar61._4_4_ = local_15a0._4_4_ * fVar126;
          auVar61._0_4_ = local_15a0._0_4_ * fVar120;
          fVar128 = auVar78._8_4_;
          auVar61._8_4_ = local_15a0._8_4_ * fVar128;
          fVar8 = auVar78._12_4_;
          auVar61._12_4_ = local_15a0._12_4_ * fVar8;
          fVar9 = auVar78._16_4_;
          auVar61._16_4_ = local_15a0._16_4_ * fVar9;
          fVar10 = auVar78._20_4_;
          auVar61._20_4_ = local_15a0._20_4_ * fVar10;
          fVar11 = auVar78._24_4_;
          auVar61._24_4_ = local_15a0._24_4_ * fVar11;
          auVar61._28_4_ = auVar22._12_4_;
          auVar111._8_4_ = 0x3f800000;
          auVar111._0_8_ = 0x3f8000003f800000;
          auVar111._12_4_ = 0x3f800000;
          auVar111._16_4_ = 0x3f800000;
          auVar111._20_4_ = 0x3f800000;
          auVar111._24_4_ = 0x3f800000;
          auVar111._28_4_ = 0x3f800000;
          auVar87 = vsubps_avx(auVar111,auVar61);
          auVar89._0_4_ = fVar120 + fVar120 * auVar87._0_4_;
          auVar89._4_4_ = fVar126 + fVar126 * auVar87._4_4_;
          auVar89._8_4_ = fVar128 + fVar128 * auVar87._8_4_;
          auVar89._12_4_ = fVar8 + fVar8 * auVar87._12_4_;
          auVar89._16_4_ = fVar9 + fVar9 * auVar87._16_4_;
          auVar89._20_4_ = fVar10 + fVar10 * auVar87._20_4_;
          auVar89._24_4_ = fVar11 + fVar11 * auVar87._24_4_;
          auVar89._28_4_ = auVar78._28_4_ + auVar87._28_4_;
          auVar100._8_4_ = 0x219392ef;
          auVar100._0_8_ = 0x219392ef219392ef;
          auVar100._12_4_ = 0x219392ef;
          auVar100._16_4_ = 0x219392ef;
          auVar100._20_4_ = 0x219392ef;
          auVar100._24_4_ = 0x219392ef;
          auVar100._28_4_ = 0x219392ef;
          auVar87 = vcmpps_avx(local_15c0,auVar100,5);
          auVar78 = vandps_avx(auVar87,auVar89);
          auVar62._4_4_ = local_17e0._4_4_ * auVar78._4_4_;
          auVar62._0_4_ = local_17e0._0_4_ * auVar78._0_4_;
          auVar62._8_4_ = local_17e0._8_4_ * auVar78._8_4_;
          auVar62._12_4_ = local_17e0._12_4_ * auVar78._12_4_;
          auVar62._16_4_ = local_17e0._16_4_ * auVar78._16_4_;
          auVar62._20_4_ = local_17e0._20_4_ * auVar78._20_4_;
          auVar62._24_4_ = local_17e0._24_4_ * auVar78._24_4_;
          auVar62._28_4_ = auVar87._28_4_;
          auVar87 = vminps_avx(auVar62,auVar111);
          auVar63._4_4_ = local_15e0._4_4_ * auVar78._4_4_;
          auVar63._0_4_ = local_15e0._0_4_ * auVar78._0_4_;
          auVar63._8_4_ = local_15e0._8_4_ * auVar78._8_4_;
          auVar63._12_4_ = local_15e0._12_4_ * auVar78._12_4_;
          auVar63._16_4_ = local_15e0._16_4_ * auVar78._16_4_;
          auVar63._20_4_ = local_15e0._20_4_ * auVar78._20_4_;
          auVar63._24_4_ = local_15e0._24_4_ * auVar78._24_4_;
          auVar63._28_4_ = auVar78._28_4_;
          auVar78 = vminps_avx(auVar63,auVar111);
          auVar122 = vsubps_avx(auVar111,auVar87);
          auVar23 = vsubps_avx(auVar111,auVar78);
          local_13e0 = vblendvps_avx(auVar78,auVar122,local_1660);
          local_1400 = vblendvps_avx(auVar87,auVar23,local_1660);
          local_13a0._4_4_ = fVar142 * (float)local_1540._4_4_;
          local_13a0._0_4_ = fVar140 * (float)local_1540._0_4_;
          local_13a0._8_4_ = fVar144 * fStack_1538;
          local_13a0._12_4_ = fVar146 * fStack_1534;
          local_13a0._16_4_ = fVar148 * fStack_1530;
          local_13a0._20_4_ = fVar156 * fStack_152c;
          local_13a0._24_4_ = fVar161 * fStack_1528;
          local_13a0._28_4_ = local_1400._28_4_;
          local_1380._4_4_ = fVar163 * (float)local_1540._4_4_;
          local_1380._0_4_ = fVar162 * (float)local_1540._0_4_;
          local_1380._8_4_ = fVar164 * fStack_1538;
          local_1380._12_4_ = fVar165 * fStack_1534;
          local_1380._16_4_ = fVar166 * fStack_1530;
          local_1380._20_4_ = fVar106 * fStack_152c;
          local_1380._24_4_ = fVar107 * fStack_1528;
          local_1380._28_4_ = auVar87._28_4_;
          local_1360[0] = (float)local_1540._0_4_ * fVar135;
          local_1360[1] = (float)local_1540._4_4_ * fVar139;
          local_1360[2] = fStack_1538 * fVar130;
          local_1360[3] = fStack_1534 * fVar131;
          fStack_1350 = fStack_1530 * fVar132;
          fStack_134c = fStack_152c * fVar133;
          fStack_1348 = fStack_1528 * fVar137;
          uStack_1344 = uStack_1524;
          auVar77 = vpacksswb_avx(auVar77,auVar77);
          uVar64 = (ulong)(byte)(SUB161(auVar77 >> 7,0) & 1 | (SUB161(auVar77 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar77 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar77 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar77 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar77 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar77 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar77 >> 0x3f,0) << 7);
          auVar152 = ZEXT3264(local_1680);
          auVar154 = ZEXT3264(local_16a0);
          auVar160 = ZEXT3264(local_16c0);
          auVar168 = ZEXT3264(local_16e0);
          auVar171 = ZEXT3264(local_1700);
          auVar181 = ZEXT3264(local_1720);
          auVar196 = ZEXT3264(local_1740);
          auVar204 = ZEXT3264(local_1760);
          auVar206 = ZEXT3264(local_1780);
          auVar105 = ZEXT3264(local_1620);
          auVar113 = ZEXT3264(local_1640);
          do {
            uVar70 = 0;
            if (uVar64 != 0) {
              for (; (uVar64 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
              }
            }
            uVar67 = *(uint *)((long)&local_1500 + uVar70 * 4);
            pGVar6 = (pSVar5->geometries).items[uVar67].ptr;
            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              uVar64 = uVar64 ^ 1L << (uVar70 & 0x3f);
            }
            else {
              local_17e0._0_8_ = uVar64;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00473ea2:
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                return bVar76;
              }
              local_12c0 = *(undefined4 *)(local_1400 + uVar70 * 4);
              local_12a0 = *(undefined4 *)(local_13e0 + uVar70 * 4);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_13c0 + uVar70 * 4);
              local_17b0.context = context->user;
              local_1280 = *(undefined4 *)((long)&local_1520 + uVar70 * 4);
              uVar2 = *(undefined4 *)(local_13a0 + uVar70 * 4);
              auVar112._4_4_ = uVar2;
              auVar112._0_4_ = uVar2;
              auVar112._8_4_ = uVar2;
              auVar112._12_4_ = uVar2;
              auVar112._16_4_ = uVar2;
              auVar112._20_4_ = uVar2;
              auVar112._24_4_ = uVar2;
              auVar112._28_4_ = uVar2;
              local_1300 = *(undefined4 *)(local_1380 + uVar70 * 4);
              local_1250 = vpshufd_avx(ZEXT416(uVar67),0);
              fVar120 = local_1360[uVar70];
              local_12e0._4_4_ = fVar120;
              local_12e0._0_4_ = fVar120;
              local_12e0._8_4_ = fVar120;
              local_12e0._12_4_ = fVar120;
              local_12e0._16_4_ = fVar120;
              local_12e0._20_4_ = fVar120;
              local_12e0._24_4_ = fVar120;
              local_12e0._28_4_ = fVar120;
              local_1320[0] = (RTCHitN)(char)uVar2;
              local_1320[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_1320[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_1320[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              local_1320[4] = (RTCHitN)(char)uVar2;
              local_1320[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_1320[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_1320[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              local_1320[8] = (RTCHitN)(char)uVar2;
              local_1320[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_1320[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_1320[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              local_1320[0xc] = (RTCHitN)(char)uVar2;
              local_1320[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_1320[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_1320[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              local_1320[0x10] = (RTCHitN)(char)uVar2;
              local_1320[0x11] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_1320[0x12] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_1320[0x13] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              local_1320[0x14] = (RTCHitN)(char)uVar2;
              local_1320[0x15] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_1320[0x16] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_1320[0x17] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              local_1320[0x18] = (RTCHitN)(char)uVar2;
              local_1320[0x19] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_1320[0x1a] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_1320[0x1b] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              local_1320[0x1c] = (RTCHitN)(char)uVar2;
              local_1320[0x1d] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_1320[0x1e] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_1320[0x1f] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              uStack_12fc = local_1300;
              uStack_12f8 = local_1300;
              uStack_12f4 = local_1300;
              uStack_12f0 = local_1300;
              uStack_12ec = local_1300;
              uStack_12e8 = local_1300;
              uStack_12e4 = local_1300;
              uStack_12bc = local_12c0;
              uStack_12b8 = local_12c0;
              uStack_12b4 = local_12c0;
              uStack_12b0 = local_12c0;
              uStack_12ac = local_12c0;
              uStack_12a8 = local_12c0;
              uStack_12a4 = local_12c0;
              uStack_129c = local_12a0;
              uStack_1298 = local_12a0;
              uStack_1294 = local_12a0;
              uStack_1290 = local_12a0;
              uStack_128c = local_12a0;
              uStack_1288 = local_12a0;
              uStack_1284 = local_12a0;
              uStack_127c = local_1280;
              uStack_1278 = local_1280;
              uStack_1274 = local_1280;
              uStack_1270 = local_1280;
              uStack_126c = local_1280;
              uStack_1268 = local_1280;
              uStack_1264 = local_1280;
              local_1260 = local_1250;
              auVar78 = vcmpps_avx(auVar112,auVar112,0xf);
              uStack_123c = (local_17b0.context)->instID[0];
              local_1240 = uStack_123c;
              uStack_1238 = uStack_123c;
              uStack_1234 = uStack_123c;
              uStack_1230 = uStack_123c;
              uStack_122c = uStack_123c;
              uStack_1228 = uStack_123c;
              uStack_1224 = uStack_123c;
              uStack_121c = (local_17b0.context)->instPrimID[0];
              local_1220 = uStack_121c;
              uStack_1218 = uStack_121c;
              uStack_1214 = uStack_121c;
              uStack_1210 = uStack_121c;
              uStack_120c = uStack_121c;
              uStack_1208 = uStack_121c;
              uStack_1204 = uStack_121c;
              local_1880 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar66 & 0xf) << 4));
              local_1870 = *(undefined1 (*) [16])
                            (mm_lookupmask_ps + (long)((int)uVar66 >> 4) * 0x10);
              local_17b0.valid = (int *)local_1880;
              local_17b0.geometryUserPtr = pGVar6->userPtr;
              local_17b0.hit = local_1320;
              local_17b0.N = 8;
              local_17b0.ray = (RTCRayN *)ray;
              if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                local_1800._0_8_ = k;
                local_1820._0_8_ = puVar72;
                local_1840._0_8_ = uVar73;
                local_1860._0_8_ = lVar71;
                auVar78 = ZEXT1632(auVar78._0_16_);
                (*pGVar6->occlusionFilterN)(&local_17b0);
                auVar78 = vcmpps_avx(auVar78,auVar78,0xf);
                auVar206 = ZEXT3264(local_1780);
                auVar204 = ZEXT3264(local_1760);
                auVar196 = ZEXT3264(local_1740);
                auVar181 = ZEXT3264(local_1720);
                auVar171 = ZEXT3264(local_1700);
                auVar168 = ZEXT3264(local_16e0);
                auVar160 = ZEXT3264(local_16c0);
                auVar154 = ZEXT3264(local_16a0);
                auVar152 = ZEXT3264(local_1680);
                k = local_1800._0_8_;
                lVar71 = local_1860._0_8_;
                puVar72 = (ulong *)local_1820._0_8_;
                uVar73 = local_1840._0_8_;
              }
              auVar77 = vpcmpeqd_avx(local_1880,ZEXT816(0) << 0x40);
              auVar4 = vpcmpeqd_avx(local_1870,ZEXT816(0) << 0x40);
              auVar101._16_16_ = auVar4;
              auVar101._0_16_ = auVar77;
              auVar87 = auVar78 & ~auVar101;
              if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar87 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar87 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar87 >> 0x7f,0) == '\0') &&
                    (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar87 >> 0xbf,0) == '\0') &&
                  (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar87[0x1f]) {
                auVar81._0_4_ = auVar77._0_4_ ^ auVar78._0_4_;
                auVar81._4_4_ = auVar77._4_4_ ^ auVar78._4_4_;
                auVar81._8_4_ = auVar77._8_4_ ^ auVar78._8_4_;
                auVar81._12_4_ = auVar77._12_4_ ^ auVar78._12_4_;
                auVar81._16_4_ = auVar4._0_4_ ^ auVar78._16_4_;
                auVar81._20_4_ = auVar4._4_4_ ^ auVar78._20_4_;
                auVar81._24_4_ = auVar4._8_4_ ^ auVar78._24_4_;
                auVar81._28_4_ = auVar4._12_4_ ^ auVar78._28_4_;
              }
              else {
                p_Var7 = context->args->filter;
                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))))
                {
                  local_1800._0_8_ = k;
                  local_1820._0_8_ = puVar72;
                  local_1840._0_8_ = uVar73;
                  local_1860._0_8_ = lVar71;
                  auVar78 = ZEXT1632(auVar78._0_16_);
                  (*p_Var7)(&local_17b0);
                  auVar78 = vcmpps_avx(auVar78,auVar78,0xf);
                  auVar206 = ZEXT3264(local_1780);
                  auVar204 = ZEXT3264(local_1760);
                  auVar196 = ZEXT3264(local_1740);
                  auVar181 = ZEXT3264(local_1720);
                  auVar171 = ZEXT3264(local_1700);
                  auVar168 = ZEXT3264(local_16e0);
                  auVar160 = ZEXT3264(local_16c0);
                  auVar154 = ZEXT3264(local_16a0);
                  auVar152 = ZEXT3264(local_1680);
                  k = local_1800._0_8_;
                  lVar71 = local_1860._0_8_;
                  puVar72 = (ulong *)local_1820._0_8_;
                  uVar73 = local_1840._0_8_;
                }
                auVar77 = vpcmpeqd_avx(local_1880,ZEXT816(0) << 0x40);
                auVar4 = vpcmpeqd_avx(local_1870,ZEXT816(0) << 0x40);
                auVar90._16_16_ = auVar4;
                auVar90._0_16_ = auVar77;
                auVar81._0_4_ = auVar77._0_4_ ^ auVar78._0_4_;
                auVar81._4_4_ = auVar77._4_4_ ^ auVar78._4_4_;
                auVar81._8_4_ = auVar77._8_4_ ^ auVar78._8_4_;
                auVar81._12_4_ = auVar77._12_4_ ^ auVar78._12_4_;
                auVar81._16_4_ = auVar4._0_4_ ^ auVar78._16_4_;
                auVar81._20_4_ = auVar4._4_4_ ^ auVar78._20_4_;
                auVar81._24_4_ = auVar4._8_4_ ^ auVar78._24_4_;
                auVar81._28_4_ = auVar4._12_4_ ^ auVar78._28_4_;
                auVar102._8_4_ = 0xff800000;
                auVar102._0_8_ = 0xff800000ff800000;
                auVar102._12_4_ = 0xff800000;
                auVar102._16_4_ = 0xff800000;
                auVar102._20_4_ = 0xff800000;
                auVar102._24_4_ = 0xff800000;
                auVar102._28_4_ = 0xff800000;
                auVar78 = vblendvps_avx(auVar102,*(undefined1 (*) [32])(local_17b0.ray + 0x100),
                                        auVar90);
                *(undefined1 (*) [32])(local_17b0.ray + 0x100) = auVar78;
              }
              auVar105 = ZEXT3264(local_1620);
              auVar113 = ZEXT3264(local_1640);
              auVar125 = ZEXT3264(local_1660);
              if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar81 >> 0x7f,0) != '\0') ||
                    (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar81 >> 0xbf,0) != '\0') ||
                  (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar81[0x1f] < '\0') goto LAB_00473ea2;
              *(int *)(ray + k * 4 + 0x100) = local_1600._0_4_;
              uVar64 = local_17e0._0_8_ ^ 1L << (uVar70 & 0x3f);
            }
          } while (uVar64 != 0);
        }
        local_1908 = local_1908 + 1;
      } while (local_1908 != lVar71);
    }
LAB_00473e8c:
    bVar76 = puVar72 != &local_1200;
    if (!bVar76) {
      return bVar76;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }